

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall Dialog::on_mouse_axes(Dialog *this,ALLEGRO_MOUSE_EVENT *event)

{
  long lVar1;
  Dialog *in_RSI;
  long in_RDI;
  int my;
  int mx;
  
  lVar1._0_4_ = in_RSI->grid_m;
  lVar1._4_4_ = in_RSI->grid_n;
  if (lVar1 == *(long *)(in_RDI + 8)) {
    if (*(long *)(in_RDI + 0x50) == 0) {
      check_mouse_over(in_RSI,in_RSI->x_padding,in_RSI->y_padding);
    }
    else {
      (**(code **)(**(long **)(in_RDI + 0x50) + 0x38))
                (*(long **)(in_RDI + 0x50),in_RSI->x_padding,in_RSI->y_padding);
    }
  }
  return;
}

Assistant:

void Dialog::on_mouse_axes(const ALLEGRO_MOUSE_EVENT & event)
{
   const int mx = event.x;
   const int my = event.y;

   if (event.display != this->display) {
      return;
   }

   if (this->mouse_down_widget) {
      this->mouse_down_widget->on_mouse_button_hold(mx, my);
      return;
   }

   this->check_mouse_over(mx, my);
}